

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::ReadPage(PF_BufferMgr *this,int fd,PageNum pageNum,char *dest)

{
  __off_t _Var1;
  ssize_t sVar2;
  int numBytes;
  long offset;
  char *dest_local;
  PageNum pageNum_local;
  int fd_local;
  PF_BufferMgr *this_local;
  
  StatisticsMgr::Register(pStatisticsMgr,PF_READPAGE,STAT_ADDONE,(int *)0x0);
  _Var1 = lseek(fd,(long)pageNum * (long)this->pageSize + 0x1000,0);
  if (_Var1 < 0) {
    this_local._4_4_ = -0xb;
  }
  else {
    sVar2 = read(fd,dest,(long)this->pageSize);
    if ((int)sVar2 < 0) {
      this_local._4_4_ = -0xb;
    }
    else if ((int)sVar2 == this->pageSize) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -3;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_BufferMgr::ReadPage(int fd, PageNum pageNum, char *dest)
{

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Reading (%d,%d).\n", fd, pageNum);
   WriteLog(psMessage);
#endif

#ifdef PF_STATS
   pStatisticsMgr->Register(PF_READPAGE, STAT_ADDONE);
#endif

   // seek to the appropriate place (cast to long for PC's)
   long offset = pageNum * (long)pageSize + PF_FILE_HDR_SIZE;
   if (lseek(fd, offset, L_SET) < 0)
      return (PF_UNIX);

   // Read the data
   int numBytes = read(fd, dest, pageSize);
   if (numBytes < 0)
      return (PF_UNIX);
   else if (numBytes != pageSize)
      return (PF_INCOMPLETEREAD);
   else
      return (0);
}